

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void __thiscall
tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void
          (tst_deprecations_helpers_qpromiseall *this)

{
  initializer_list<QtPromise::QPromise<void>_> args;
  bool bVar1;
  byte bVar2;
  int iVar3;
  QPromise<void> *local_f0;
  bool local_e2;
  bool local_e1;
  int local_e0 [2];
  bool local_d6;
  bool local_d5;
  bool local_d4;
  bool local_d3;
  bool local_d2;
  bool local_d1 [7];
  bool local_ca;
  bool local_c9;
  QPromise<void> *local_c8;
  QPromise<void> local_c0;
  QPromise<void> local_b0;
  QPromise<void> local_a0;
  QPromise<void> local_90;
  QList<QtPromise::QPromise<void>_> local_80;
  undefined1 local_68 [8];
  QPromise<void> p;
  undefined1 local_50 [8];
  QPromise<void> p2;
  undefined1 local_30 [8];
  QPromise<void> p1;
  QPromise<void> p0;
  tst_deprecations_helpers_qpromiseall *this_local;
  
  QtPromise::resolve();
  QtPromise::resolve();
  QtPromise::QPromise<void>::
  QPromise<tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void()::__0>
            ((QPromise<void> *)local_50,
             (anon_class_1_0_00000001 *)((long)&p.super_QPromiseBase<void>.m_d.d + 7));
  local_c8 = &local_c0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)&p1.super_QPromiseBase<void>.m_d);
  local_c8 = &local_b0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)local_50);
  local_c8 = &local_a0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)local_30);
  local_90.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&local_c0;
  local_90.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_90.super_QPromiseBase<void>._vptr_QPromiseBase;
  QList<QtPromise::QPromise<void>_>::QList(&local_80,args);
  QtPromise::qPromiseAll<QList<QtPromise::QPromise<void>>>((QtPromise *)local_68,&local_80);
  QList<QtPromise::QPromise<void>_>::~QList(&local_80);
  local_f0 = &local_90;
  do {
    local_f0 = local_f0 + -1;
    QtPromise::QPromise<void>::~QPromise(local_f0);
  } while (local_f0 != &local_c0);
  local_c9 = QtPromise::QPromiseBase<void>::isFulfilled
                       ((QPromiseBase<void> *)&p1.super_QPromiseBase<void>.m_d);
  local_ca = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_c9,&local_ca,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x82);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_d1[0] = QtPromise::QPromiseBase<void>::isFulfilled((QPromiseBase<void> *)local_30);
    local_d2 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_d1,&local_d2,"p1.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x83);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_d3 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_50);
      local_d4 = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_d3,&local_d4,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x84);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_d5 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_68);
        local_d6 = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_d5,&local_d6,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x85);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_e0[1] = 0xffffffff;
          local_e0[0] = 0x2a;
          iVar3 = waitForValue<int>((QPromise<void> *)local_68,local_e0 + 1,local_e0);
          bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1, 42)","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                  ,0x86);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            local_e1 = QtPromise::QPromiseBase<void>::isFulfilled((QPromiseBase<void> *)local_50);
            local_e2 = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_e1,&local_e2,"p2.isFulfilled()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0x87);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_d1[1] = false;
              local_d1[2] = false;
              local_d1[3] = false;
              local_d1[4] = false;
            }
            else {
              local_d1[1] = true;
              local_d1[2] = false;
              local_d1[3] = false;
              local_d1[4] = false;
            }
          }
          else {
            local_d1[1] = true;
            local_d1[2] = false;
            local_d1[3] = false;
            local_d1[4] = false;
          }
        }
        else {
          local_d1[1] = true;
          local_d1[2] = false;
          local_d1[3] = false;
          local_d1[4] = false;
        }
      }
      else {
        local_d1[1] = true;
        local_d1[2] = false;
        local_d1[3] = false;
        local_d1[4] = false;
      }
    }
    else {
      local_d1[1] = true;
      local_d1[2] = false;
      local_d1[3] = false;
      local_d1[4] = false;
    }
  }
  else {
    local_d1[1] = true;
    local_d1[2] = false;
    local_d1[3] = false;
    local_d1[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_68);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_50);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_30);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&p1.super_QPromiseBase<void>.m_d);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p2.isFulfilled(), true);
}